

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O0

void __thiscall tcmalloc::ThreadCache::ListTooLong(ThreadCache *this,FreeList *list,uint32_t cl)

{
  int32_t iVar1;
  int N;
  SizeMap *this_00;
  size_t sVar2;
  int batch_size;
  uint32_t cl_local;
  FreeList *list_local;
  ThreadCache *this_local;
  
  iVar1 = FreeList::object_size(list);
  this->size_ = iVar1 + this->size_;
  this_00 = Static::sizemap();
  N = SizeMap::num_objects_to_move(this_00,cl);
  ReleaseToCentralCache(this,list,cl,N);
  sVar2 = FreeList::max_length(list);
  if (sVar2 < (ulong)(long)N) {
    sVar2 = FreeList::max_length(list);
    FreeList::set_max_length(list,sVar2 + 1);
  }
  else {
    sVar2 = FreeList::max_length(list);
    if ((ulong)(long)N < sVar2) {
      sVar2 = FreeList::length_overages(list);
      FreeList::set_length_overages(list,sVar2 + 1);
      sVar2 = FreeList::length_overages(list);
      if (3 < sVar2) {
        sVar2 = FreeList::max_length(list);
        FreeList::set_max_length(list,sVar2 - (long)N);
        FreeList::set_length_overages(list,0);
      }
    }
  }
  if (this->max_size_ < this->size_) {
    Scavenge(this);
  }
  return;
}

Assistant:

void ThreadCache::ListTooLong(FreeList* list, uint32_t cl) {
  size_ += list->object_size();

  const int batch_size = Static::sizemap()->num_objects_to_move(cl);
  ReleaseToCentralCache(list, cl, batch_size);

  // If the list is too long, we need to transfer some number of
  // objects to the central cache.  Ideally, we would transfer
  // num_objects_to_move, so the code below tries to make max_length
  // converge on num_objects_to_move.

  if (list->max_length() < batch_size) {
    // Slow start the max_length so we don't overreserve.
    list->set_max_length(list->max_length() + 1);
  } else if (list->max_length() > batch_size) {
    // If we consistently go over max_length, shrink max_length.  If we don't
    // shrink it, some amount of memory will always stay in this freelist.
    list->set_length_overages(list->length_overages() + 1);
    if (list->length_overages() > kMaxOverages) {
      ASSERT(list->max_length() > batch_size);
      list->set_max_length(list->max_length() - batch_size);
      list->set_length_overages(0);
    }
  }

  if (PREDICT_FALSE(size_ > max_size_)) {
    Scavenge();
  }
}